

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclass.cpp
# Opt level: O1

bool __thiscall
SQClass::NewSlot(SQClass *this,SQSharedState *ss,SQObjectPtr *key,SQObjectPtr *val,bool bstatic)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  uint uVar5;
  SQTable *pSVar6;
  SQClass *pSVar7;
  ulong uVar8;
  SQUnsignedInteger SVar9;
  long *plVar10;
  SQDelegable *pSVar11;
  bool bVar12;
  SQInteger SVar13;
  ulong uVar14;
  SQObjectValue SVar15;
  SQClassMember *pSVar16;
  byte bVar17;
  byte bVar18;
  SQObjectPtr *this_00;
  SQUnsignedInteger SVar19;
  bool isconstructor;
  SQObjectPtr theval;
  SQClassMember m;
  SQObjectPtr temp;
  bool local_81;
  SQObjectPtr local_80;
  SQObjectPtr local_70;
  SQObjectPtr local_60;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  
  local_50.super_SQObject._unVal.pTable = (SQTable *)0x0;
  local_50.super_SQObject._type = OT_NULL;
  SVar3 = (val->super_SQObject)._type;
  bVar18 = 1;
  if ((SVar3 != OT_CLOSURE) && (SVar3 != OT_NATIVECLOSURE)) {
    bVar18 = bstatic;
  }
  bVar17 = this->_locked ^ 1U | bVar18;
  if (bVar17 == 1) {
    bVar12 = SQTable::Get(this->_members,key,&local_50);
    if ((bVar12) && ((local_50.super_SQObject._unVal._0_4_ >> 0x19 & 1) != 0)) {
      pSVar16 = (this->_defaultvalues)._vals;
      uVar14 = (ulong)((local_50.super_SQObject._unVal._0_4_ & 0xffffff) << 5);
      uVar5 = *(uint *)((long)&(pSVar16->val).super_SQObject._type + uVar14);
      plVar10 = *(long **)((long)&(pSVar16->val).super_SQObject._unVal + uVar14);
      *(SQObjectValue *)((long)&(pSVar16->val).super_SQObject._unVal + uVar14) =
           (val->super_SQObject)._unVal;
      SVar3 = (val->super_SQObject)._type;
      *(SQObjectType *)((long)&(pSVar16->val).super_SQObject._type + uVar14) = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(*(long *)((long)&(pSVar16->val).super_SQObject._unVal + uVar14) + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar5 >> 0x1b & 1) != 0) {
        plVar2 = plVar10 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar10 + 0x10))();
        }
      }
    }
    else {
      if (bVar18 == 0) {
        local_60.super_SQObject._unVal.pTable = (SQTable *)0x0;
        local_60.super_SQObject._type = OT_NULL;
        local_70.super_SQObject._unVal = (SQObjectValue)(val->super_SQObject)._unVal.pTable;
        local_70.super_SQObject._type = (val->super_SQObject)._type;
        if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_70.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        local_80.super_SQObject._unVal.nInteger = (this->_defaultvalues)._size | 0x2000000;
        local_80.super_SQObject._type = OT_INTEGER;
        SQTable::NewSlot(this->_members,key,&local_80);
        SQObjectPtr::~SQObjectPtr(&local_80);
        uVar14 = (this->_defaultvalues)._size;
        uVar8 = (this->_defaultvalues)._allocated;
        if (uVar8 <= uVar14) {
          SVar9 = uVar14 * 2;
          SVar19 = 4;
          if (SVar9 != 0) {
            SVar19 = SVar9;
          }
          pSVar16 = (SQClassMember *)
                    sq_vm_realloc((this->_defaultvalues)._vals,uVar8 << 5,SVar19 << 5);
          (this->_defaultvalues)._vals = pSVar16;
          (this->_defaultvalues)._allocated = SVar19;
        }
        pSVar16 = (this->_defaultvalues)._vals;
        SVar9 = (this->_defaultvalues)._size;
        (this->_defaultvalues)._size = SVar9 + 1;
        pSVar16[SVar9].val.super_SQObject._type = local_70.super_SQObject._type;
        pSVar16[SVar9].val.super_SQObject._unVal.pTable = (SQTable *)local_70.super_SQObject._unVal;
        if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((pSVar16[SVar9].val.super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        pSVar16[SVar9].attrs.super_SQObject._type = local_60.super_SQObject._type;
        pSVar16[SVar9].attrs.super_SQObject._unVal.pTable =
             (SQTable *)local_60.super_SQObject._unVal;
        if ((local_60.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((pSVar16[SVar9].attrs.super_SQObject._unVal.pTable)->super_SQDelegable).
                    super_SQCollectable.super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        SQObjectPtr::~SQObjectPtr(&local_60);
        this_00 = &local_70;
      }
      else {
        SVar3 = (val->super_SQObject)._type;
        if ((SVar3 == OT_NATIVECLOSURE) || (SVar3 == OT_CLOSURE)) {
          SVar13 = SQSharedState::GetMetaMethodIdxByName(ss,key);
          if (SVar13 != -1) {
            SVar3 = this->_metamethods[SVar13].super_SQObject._type;
            pSVar6 = this->_metamethods[SVar13].super_SQObject._unVal.pTable;
            this->_metamethods[SVar13].super_SQObject._unVal = (val->super_SQObject)._unVal;
            SVar4 = (val->super_SQObject)._type;
            this->_metamethods[SVar13].super_SQObject._type = SVar4;
            if ((SVar4 >> 0x1b & 1) != 0) {
              pSVar1 = &((this->_metamethods[SVar13].super_SQObject._unVal.pTable)->
                        super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 + 1;
            }
            if ((SVar3 >> 0x1b & 1) != 0) {
              pSVar1 = &(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
              *pSVar1 = *pSVar1 - 1;
              if (*pSVar1 == 0) {
                (*(pSVar6->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                  _vptr_SQRefCounted[2])();
              }
            }
            goto LAB_001194a7;
          }
        }
        local_80.super_SQObject._type = (val->super_SQObject)._type;
        local_80.super_SQObject._unVal = (SQObjectValue)(val->super_SQObject)._unVal.pTable;
        if ((local_80.super_SQObject._type >> 0x1b & 1) != 0) {
          pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable
                    .super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if ((this->_base != (SQClass *)0x0) && ((val->super_SQObject)._type == OT_CLOSURE)) {
          SVar15.pClosure = SQClosure::Clone((val->super_SQObject)._unVal.pClosure);
          SVar3 = local_80.super_SQObject._type;
          local_80.super_SQObject._type = OT_CLOSURE;
          pSVar1 = &((SVar15.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                    _uiRef;
          *pSVar1 = *pSVar1 + 1;
          if ((SVar3 >> 0x1b & 1) != 0) {
            pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 - 1;
            if (*pSVar1 == 0) {
              pSVar11 = &(local_80.super_SQObject._unVal.pTable)->super_SQDelegable;
              local_80.super_SQObject._unVal.pClosure = SVar15.pClosure;
              (*(pSVar11->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted[2])();
              SVar15 = local_80.super_SQObject._unVal;
            }
          }
          local_80.super_SQObject._unVal = SVar15;
          pSVar7 = this->_base;
          (local_80.super_SQObject._unVal.pClosure)->_base = pSVar7;
          pSVar1 = &(pSVar7->super_SQCollectable).super_SQRefCounted._uiRef;
          *pSVar1 = *pSVar1 + 1;
        }
        if (local_50.super_SQObject._type == OT_NULL) {
          SQVM::IsEqual(&ss->_constructoridx,key,&local_81);
          if (local_81 == true) {
            this->_constructoridx = (this->_methods)._size;
          }
          local_60.super_SQObject._unVal.pTable = (SQTable *)0x0;
          local_60.super_SQObject._type = OT_NULL;
          local_70.super_SQObject._unVal.pTable = local_80.super_SQObject._unVal.pTable;
          local_70.super_SQObject._type = local_80.super_SQObject._type;
          if ((local_80.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((local_80.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          local_40.super_SQObject._unVal.nInteger = (this->_methods)._size | 0x1000000;
          local_40.super_SQObject._type = OT_INTEGER;
          SQTable::NewSlot(this->_members,key,&local_40);
          SQObjectPtr::~SQObjectPtr(&local_40);
          uVar14 = (this->_methods)._size;
          uVar8 = (this->_methods)._allocated;
          if (uVar8 <= uVar14) {
            SVar9 = uVar14 * 2;
            SVar19 = 4;
            if (SVar9 != 0) {
              SVar19 = SVar9;
            }
            pSVar16 = (SQClassMember *)sq_vm_realloc((this->_methods)._vals,uVar8 << 5,SVar19 << 5);
            (this->_methods)._vals = pSVar16;
            (this->_methods)._allocated = SVar19;
          }
          pSVar16 = (this->_methods)._vals;
          SVar9 = (this->_methods)._size;
          (this->_methods)._size = SVar9 + 1;
          pSVar16[SVar9].val.super_SQObject._type = local_70.super_SQObject._type;
          pSVar16[SVar9].val.super_SQObject._unVal.pTable =
               (SQTable *)local_70.super_SQObject._unVal;
          if ((local_70.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((pSVar16[SVar9].val.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          pSVar16[SVar9].attrs.super_SQObject._type = local_60.super_SQObject._type;
          pSVar16[SVar9].attrs.super_SQObject._unVal.pTable =
               (SQTable *)local_60.super_SQObject._unVal;
          if ((local_60.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((pSVar16[SVar9].attrs.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          SQObjectPtr::~SQObjectPtr(&local_60);
          SQObjectPtr::~SQObjectPtr(&local_70);
        }
        else {
          pSVar16 = (this->_methods)._vals;
          uVar14 = (ulong)(((uint)local_50.super_SQObject._unVal.fFloat & 0xffffff) << 5);
          uVar5 = *(uint *)((long)&(pSVar16->val).super_SQObject._type + uVar14);
          plVar10 = *(long **)((long)&(pSVar16->val).super_SQObject._unVal + uVar14);
          ((SQObjectValue *)((long)&(pSVar16->val).super_SQObject._unVal + uVar14))->pTable =
               (SQTable *)local_80.super_SQObject._unVal;
          *(SQObjectType *)((long)&(pSVar16->val).super_SQObject._type + uVar14) =
               local_80.super_SQObject._type;
          if ((local_80.super_SQObject._type >> 0x1b & 1) != 0) {
            plVar2 = (long *)(*(long *)((long)&(pSVar16->val).super_SQObject._unVal + uVar14) + 8);
            *plVar2 = *plVar2 + 1;
          }
          if ((uVar5 >> 0x1b & 1) != 0) {
            plVar2 = plVar10 + 1;
            *plVar2 = *plVar2 + -1;
            if (*plVar2 == 0) {
              (**(code **)(*plVar10 + 0x10))();
            }
          }
        }
        this_00 = &local_80;
      }
      SQObjectPtr::~SQObjectPtr(this_00);
    }
  }
LAB_001194a7:
  SQObjectPtr::~SQObjectPtr(&local_50);
  return (bool)bVar17;
}

Assistant:

bool SQClass::NewSlot(SQSharedState *ss,const SQObjectPtr &key,const SQObjectPtr &val,bool bstatic)
{
    SQObjectPtr temp;
    bool belongs_to_static_table = type(val) == OT_CLOSURE || type(val) == OT_NATIVECLOSURE || bstatic;
    if(_locked && !belongs_to_static_table)
        return false; //the class already has an instance so cannot be modified
    if(_members->Get(key,temp) && _isfield(temp)) //overrides the default value
    {
        _defaultvalues[_member_idx(temp)].val = val;
        return true;
    }
    if(belongs_to_static_table) {
        SQInteger mmidx;
        if((type(val) == OT_CLOSURE || type(val) == OT_NATIVECLOSURE) &&
            (mmidx = ss->GetMetaMethodIdxByName(key)) != -1) {
            _metamethods[mmidx] = val;
        }
        else {
            SQObjectPtr theval = val;
            if(_base && type(val) == OT_CLOSURE) {
                theval = _closure(val)->Clone();
                _closure(theval)->_base = _base;
                __ObjAddRef(_base); //ref for the closure
            }
            if(type(temp) == OT_NULL) {
                bool isconstructor;
                SQVM::IsEqual(ss->_constructoridx, key, isconstructor);
                if(isconstructor) {
                    _constructoridx = (SQInteger)_methods.size();
                }
                SQClassMember m;
                m.val = theval;
                _members->NewSlot(key,SQObjectPtr(_make_method_idx(_methods.size())));
                _methods.push_back(m);
            }
            else {
                _methods[_member_idx(temp)].val = theval;
            }
        }
        return true;
    }
    SQClassMember m;
    m.val = val;
    _members->NewSlot(key,SQObjectPtr(_make_field_idx(_defaultvalues.size())));
    _defaultvalues.push_back(m);
    return true;
}